

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_from_stream.cc
# Opt level: O3

bool __thiscall
sptk::InputSourceFromStream::Get
          (InputSourceFromStream *this,vector<double,_std::allocator<double>_> *buffer)

{
  bool bVar1;
  
  if ((buffer != (vector<double,_std::allocator<double>_> *)0x0) && (this->is_valid_ == true)) {
    bVar1 = ReadStream<double>(this->zero_padding_,0,0,this->read_size_,buffer,this->input_stream_,
                               (int *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

bool InputSourceFromStream::Get(std::vector<double>* buffer) {
  if (NULL == buffer || !is_valid_) {
    return false;
  }
  return sptk::ReadStream(zero_padding_, 0, 0, read_size_, buffer,
                          input_stream_, NULL);
}